

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Aggregate_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Aggregate_State_PDU::SetAggregateIDList
          (Aggregate_State_PDU *this,
          vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
          *AI)

{
  size_type sVar1;
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  *AI_local;
  Aggregate_State_PDU *this_local;
  
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + this->m_ui16NumAggregates * -6;
  std::
  vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
  ::operator=(&this->m_vAI,AI);
  sVar1 = std::
          vector<KDIS::DATA_TYPE::AggregateIdentifier,_std::allocator<KDIS::DATA_TYPE::AggregateIdentifier>_>
          ::size(&this->m_vAI);
  this->m_ui16NumAggregates = (KUINT16)sVar1;
  (this->super_Header).super_Header6.m_ui16PDULength =
       (this->super_Header).super_Header6.m_ui16PDULength + this->m_ui16NumAggregates * 6;
  updatePadding(this);
  return;
}

Assistant:

void Aggregate_State_PDU::SetAggregateIDList( const vector<AggregateIdentifier> & AI )
{
    // Reset the PDU length field
    m_ui16PDULength -= m_ui16NumAggregates * AggregateIdentifier::AGGREGATE_IDENTIFER_SIZE;

    m_vAI = AI;
    m_ui16NumAggregates = m_vAI.size();
    m_ui16PDULength += m_ui16NumAggregates * AggregateIdentifier::AGGREGATE_IDENTIFER_SIZE;
    updatePadding();
}